

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  uint uVar1;
  BVH *bvh;
  NodeRef root;
  float *pfVar2;
  Ref<embree::Geometry> *pRVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  bool bVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [12];
  vfloat<4> vVar26;
  vbool<4> vVar27;
  uint uVar28;
  float *vertices;
  Scene *pSVar29;
  RTCRayN *pRVar30;
  int iVar31;
  undefined4 uVar32;
  RTCIntersectArguments *pRVar33;
  Intersectors *pIVar34;
  ulong uVar35;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar36;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar37;
  Scene *pSVar38;
  long lVar39;
  ulong uVar40;
  NodeRef *pNVar41;
  bool bVar42;
  float fVar43;
  float fVar63;
  float fVar64;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar65;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar66;
  float fVar74;
  float fVar75;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar76;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar77;
  float fVar83;
  float fVar84;
  undefined1 auVar78 [16];
  float fVar85;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar92;
  float fVar95;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar93;
  float fVar94;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar91 [16];
  float fVar101;
  float fVar105;
  float fVar106;
  undefined1 auVar102 [16];
  float fVar107;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar108;
  float fVar109;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar116;
  float fVar117;
  uint uVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar124;
  float fVar129;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar128 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar132;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  uint uVar138;
  float fVar139;
  float fVar140;
  uint uVar143;
  float fVar144;
  float fVar145;
  uint uVar146;
  float fVar147;
  float fVar148;
  uint uVar149;
  float fVar150;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  uint uVar151;
  float fVar152;
  uint uVar153;
  float fVar154;
  uint uVar155;
  float fVar156;
  uint uVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  TravRayK<4,_true> *tray_00;
  size_t sVar186;
  Precalculations pre;
  float local_1a88;
  float fStack_1a84;
  float fStack_1a80;
  float fStack_1a7c;
  undefined1 local_1a58 [16];
  vbool<4> terminated;
  undefined1 local_19d8 [16];
  Scene *local_19c8;
  vuint<4> *v;
  RTCFilterFunctionNArguments args;
  TravRayK<4,_true> tray;
  undefined1 local_18a8 [16];
  undefined1 local_1898 [16];
  undefined1 local_1888 [16];
  float local_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined8 local_1848;
  undefined8 uStack_1840;
  undefined8 uStack_1810;
  undefined8 uStack_17f0;
  longlong local_1788;
  longlong lStack_1780;
  longlong local_1778;
  longlong lStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined4 local_1718;
  undefined4 uStack_1714;
  undefined4 uStack_1710;
  undefined4 uStack_170c;
  uint local_1708;
  uint uStack_1704;
  uint uStack_1700;
  uint uStack_16fc;
  uint local_16f8;
  uint uStack_16f4;
  uint uStack_16f0;
  uint uStack_16ec;
  uint local_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar127 [16];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    pRVar33 = (RTCIntersectArguments *)context;
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       (pRVar33 = context->args, ((ulong)*(Scene **)&pRVar33->flags & 0x10000) != 0)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar134._8_4_ = 0xffffffff;
    auVar134._0_8_ = 0xffffffffffffffff;
    auVar134._12_4_ = 0xffffffff;
    auVar119 = *(undefined1 (*) [16])(ray + 0x80);
    auVar142._0_12_ = ZEXT812(0);
    auVar142._12_4_ = 0;
    uVar151 = -(uint)(0.0 <= auVar119._0_4_ && (valid_i->field_0).i[0] == -1);
    uVar153 = -(uint)(0.0 <= auVar119._4_4_ && (valid_i->field_0).i[1] == -1);
    uVar155 = -(uint)(0.0 <= auVar119._8_4_ && (valid_i->field_0).i[2] == -1);
    uVar157 = -(uint)(0.0 <= auVar119._12_4_ && (valid_i->field_0).i[3] == -1);
    auVar67._4_4_ = uVar153;
    auVar67._0_4_ = uVar151;
    auVar67._8_4_ = uVar155;
    auVar67._12_4_ = uVar157;
    iVar31 = movmskps((int)pRVar33,auVar67);
    if (iVar31 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      uVar138 = (uint)DAT_01fec6c0;
      uVar143 = DAT_01fec6c0._4_4_;
      uVar146 = DAT_01fec6c0._8_4_;
      uVar149 = DAT_01fec6c0._12_4_;
      auVar130 = divps(_DAT_01feca10,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar44._4_4_ = -(uint)((float)(tray.dir.field_0._4_4_ & uVar143) < 1e-18);
      auVar44._0_4_ = -(uint)((float)(tray.dir.field_0._0_4_ & uVar138) < 1e-18);
      auVar44._8_4_ = -(uint)((float)(tray.dir.field_0._8_4_ & uVar146) < 1e-18);
      auVar44._12_4_ = -(uint)((float)(tray.dir.field_0._12_4_ & uVar149) < 1e-18);
      auVar89 = divps(_DAT_01feca10,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar45._4_4_ = -(uint)((float)(tray.dir.field_0._20_4_ & uVar143) < 1e-18);
      auVar45._0_4_ = -(uint)((float)(tray.dir.field_0._16_4_ & uVar138) < 1e-18);
      auVar67 = divps(_DAT_01feca10,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)blendvps(auVar130,_DAT_0201c930,auVar44)
      ;
      auVar45._8_4_ = -(uint)((float)(tray.dir.field_0._24_4_ & uVar146) < 1e-18);
      auVar45._12_4_ = -(uint)((float)(tray.dir.field_0._28_4_ & uVar149) < 1e-18);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)blendvps(auVar89,_DAT_0201c930,auVar45);
      auVar89._4_4_ = -(uint)((float)(tray.dir.field_0._36_4_ & uVar143) < 1e-18);
      auVar89._0_4_ = -(uint)((float)(tray.dir.field_0._32_4_ & uVar138) < 1e-18);
      auVar89._8_4_ = -(uint)((float)(tray.dir.field_0._40_4_ & uVar146) < 1e-18);
      auVar89._12_4_ = -(uint)((float)(tray.dir.field_0._44_4_ & uVar149) < 1e-18);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)blendvps(auVar67,_DAT_0201c930,auVar89);
      tray.nearXYZ.field_0._0_8_ =
           CONCAT44(-(uint)(tray.rdir.field_0._4_4_ < 0.0),-(uint)(tray.rdir.field_0._0_4_ < 0.0)) &
           0x1000000010;
      tray.nearXYZ.field_0._8_4_ = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar130._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar130._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar130._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar130._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fed0,_DAT_01ffd210,auVar130);
      auVar46._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar46._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar46._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar46._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fef0,_DAT_0201fee0,auVar46);
      auVar67 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar142);
      auVar119 = maxps(auVar119,auVar142);
      fVar158 = (float)DAT_01feb9f0;
      fVar161 = DAT_01feb9f0._4_4_;
      fVar164 = DAT_01feb9f0._8_4_;
      fVar167 = DAT_01feb9f0._12_4_;
      auVar47._4_4_ = uVar153;
      auVar47._0_4_ = uVar151;
      auVar47._8_4_ = uVar155;
      auVar47._12_4_ = uVar157;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01feb9f0,auVar67,auVar47);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01feba00,auVar119,auVar47);
      auVar119._4_4_ = uVar153;
      auVar119._0_4_ = uVar151;
      auVar119._8_4_ = uVar155;
      auVar119._12_4_ = uVar157;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar134 ^ auVar119);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar138 = 3;
      }
      else {
        uVar138 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                  RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar41 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01feb9f0;
      sVar186 = (bvh->root).ptr;
      stack_node[1].ptr = sVar186;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      paVar36 = &stack_near[2].field_0;
LAB_0023eeea:
      paVar37 = paVar36 + -1;
      root.ptr = pNVar41[-1].ptr;
      pNVar41 = pNVar41 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_0023fa77;
      local_1a88 = paVar37->v[0];
      fStack_1a84 = *(float *)((long)paVar36 + -0xc);
      fStack_1a80 = *(float *)((long)paVar36 + -8);
      fStack_1a7c = *(float *)((long)paVar36 + -4);
      vVar26.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar37->v;
      auVar48._4_4_ = -(uint)(fStack_1a84 < tray.tfar.field_0.v[1]);
      auVar48._0_4_ = -(uint)(local_1a88 < tray.tfar.field_0.v[0]);
      auVar48._8_4_ = -(uint)(fStack_1a80 < tray.tfar.field_0.v[2]);
      auVar48._12_4_ = -(uint)(fStack_1a7c < tray.tfar.field_0.v[3]);
      uVar143 = movmskps((int)sVar186,auVar48);
      if (uVar143 == 0) {
LAB_0023fa88:
        sVar186 = 2;
      }
      else {
        uVar40 = (ulong)(uVar143 & 0xff);
        uVar143 = POPCOUNT(uVar143 & 0xff);
        sVar186 = 0;
        if (uVar143 <= uVar138) {
          do {
            sVar186 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> sVar186 & 1) == 0; sVar186 = sVar186 + 1) {
              }
            }
            tray_00 = &tray;
            valid_i = (vint<4> *)This;
            bVar42 = occluded1(This,bvh,root,sVar186,&pre,ray,tray_00,context);
            if (bVar42) {
              terminated.field_0.i[sVar186] = -1;
            }
            uVar40 = uVar40 & uVar40 - 1;
          } while (uVar40 != 0);
          iVar31 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
          sVar186 = 3;
          fVar158 = INFINITY;
          fVar161 = INFINITY;
          fVar164 = INFINITY;
          fVar167 = INFINITY;
          local_1a88 = vVar26.field_0._0_4_;
          fStack_1a84 = vVar26.field_0._4_4_;
          fStack_1a80 = vVar26.field_0._8_4_;
          fStack_1a7c = vVar26.field_0._12_4_;
          if (iVar31 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                          (undefined1  [16])terminated.field_0);
            sVar186 = 2;
          }
        }
        vVar27.field_0 = terminated.field_0;
        uVar32 = (undefined4)sVar186;
        if (uVar138 < uVar143) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0023fa77;
              auVar53._4_4_ = -(uint)(fStack_1a84 < tray.tfar.field_0.v[1]);
              auVar53._0_4_ = -(uint)(local_1a88 < tray.tfar.field_0.v[0]);
              auVar53._8_4_ = -(uint)(fStack_1a80 < tray.tfar.field_0.v[2]);
              auVar53._12_4_ = -(uint)(fStack_1a7c < tray.tfar.field_0.v[3]);
              iVar31 = movmskps(uVar32,auVar53);
              if (iVar31 == 0) goto LAB_0023fa88;
              valid_i = (vint<4> *)((ulong)((uint)root.ptr & 0xf) - 8);
              if ((Intersectors *)valid_i == (Intersectors *)0x0) goto LAB_0023fa44;
              auVar54._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              auVar54._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
              auVar54._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
              lVar39 = (root.ptr & 0xfffffffffffffff0) + 0x40;
              pIVar34 = (Intersectors *)0x0;
              goto LAB_0023f131;
            }
            pIVar34 = (Intersectors *)0x0;
            uVar40 = 8;
            local_1a88 = fVar158;
            fStack_1a84 = fVar161;
            fStack_1a80 = fVar164;
            fStack_1a7c = fVar167;
            do {
              uVar35 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + (long)pIVar34 * 8);
              if (uVar35 != 8) {
                fVar85 = *(float *)(root.ptr + 0x20 + (long)pIVar34 * 4);
                fVar98 = *(float *)(root.ptr + 0x30 + (long)pIVar34 * 4);
                fVar107 = *(float *)(root.ptr + 0x40 + (long)pIVar34 * 4);
                fVar65 = *(float *)(root.ptr + 0x50 + (long)pIVar34 * 4);
                auVar68._0_8_ =
                     CONCAT44((fVar85 - (float)tray.org.field_0._4_4_) * tray.rdir.field_0._4_4_,
                              (fVar85 - (float)tray.org.field_0._0_4_) * tray.rdir.field_0._0_4_);
                auVar68._8_4_ = (fVar85 - (float)tray.org.field_0._8_4_) * tray.rdir.field_0._8_4_;
                auVar68._12_4_ =
                     (fVar85 - (float)tray.org.field_0._12_4_) * tray.rdir.field_0._12_4_;
                auVar49._0_8_ =
                     CONCAT44((fVar107 - (float)tray.org.field_0._20_4_) * tray.rdir.field_0._20_4_,
                              (fVar107 - (float)tray.org.field_0._16_4_) * tray.rdir.field_0._16_4_)
                ;
                auVar49._8_4_ =
                     (fVar107 - (float)tray.org.field_0._24_4_) * tray.rdir.field_0._24_4_;
                auVar49._12_4_ =
                     (fVar107 - (float)tray.org.field_0._28_4_) * tray.rdir.field_0._28_4_;
                fVar85 = *(float *)(root.ptr + 0x60 + (long)pIVar34 * 4);
                auVar102._0_8_ =
                     CONCAT44((fVar85 - (float)tray.org.field_0._36_4_) * tray.rdir.field_0._36_4_,
                              (fVar85 - (float)tray.org.field_0._32_4_) * tray.rdir.field_0._32_4_);
                auVar102._8_4_ =
                     (fVar85 - (float)tray.org.field_0._40_4_) * tray.rdir.field_0._40_4_;
                auVar102._12_4_ =
                     (fVar85 - (float)tray.org.field_0._44_4_) * tray.rdir.field_0._44_4_;
                auVar78._0_4_ = (fVar98 - (float)tray.org.field_0._0_4_) * tray.rdir.field_0._0_4_;
                auVar78._4_4_ = (fVar98 - (float)tray.org.field_0._4_4_) * tray.rdir.field_0._4_4_;
                auVar78._8_4_ = (fVar98 - (float)tray.org.field_0._8_4_) * tray.rdir.field_0._8_4_;
                auVar78._12_4_ =
                     (fVar98 - (float)tray.org.field_0._12_4_) * tray.rdir.field_0._12_4_;
                auVar90._0_4_ = (fVar65 - (float)tray.org.field_0._16_4_) * tray.rdir.field_0._16_4_
                ;
                auVar90._4_4_ = (fVar65 - (float)tray.org.field_0._20_4_) * tray.rdir.field_0._20_4_
                ;
                auVar90._8_4_ = (fVar65 - (float)tray.org.field_0._24_4_) * tray.rdir.field_0._24_4_
                ;
                auVar90._12_4_ =
                     (fVar65 - (float)tray.org.field_0._28_4_) * tray.rdir.field_0._28_4_;
                fVar85 = *(float *)(root.ptr + 0x70 + (long)pIVar34 * 4);
                auVar120._0_4_ =
                     (fVar85 - (float)tray.org.field_0._32_4_) * tray.rdir.field_0._32_4_;
                auVar120._4_4_ =
                     (fVar85 - (float)tray.org.field_0._36_4_) * tray.rdir.field_0._36_4_;
                auVar120._8_4_ =
                     (fVar85 - (float)tray.org.field_0._40_4_) * tray.rdir.field_0._40_4_;
                auVar120._12_4_ =
                     (fVar85 - (float)tray.org.field_0._44_4_) * tray.rdir.field_0._44_4_;
                auVar110._8_4_ = auVar68._8_4_;
                auVar110._0_8_ = auVar68._0_8_;
                auVar110._12_4_ = auVar68._12_4_;
                auVar119 = minps(auVar110,auVar78);
                auVar125._8_4_ = auVar49._8_4_;
                auVar125._0_8_ = auVar49._0_8_;
                auVar125._12_4_ = auVar49._12_4_;
                auVar67 = minps(auVar125,auVar90);
                auVar119 = maxps(auVar119,auVar67);
                auVar126._8_4_ = auVar102._8_4_;
                auVar126._0_8_ = auVar102._0_8_;
                auVar126._12_4_ = auVar102._12_4_;
                auVar67 = minps(auVar126,auVar120);
                auVar119 = maxps(auVar119,auVar67);
                auVar111._0_8_ = CONCAT44(auVar119._4_4_ * 0.99999964,auVar119._0_4_ * 0.99999964);
                auVar111._8_4_ = auVar119._8_4_ * 0.99999964;
                auVar111._12_4_ = auVar119._12_4_ * 0.99999964;
                auVar67 = maxps(auVar68,auVar78);
                auVar119 = maxps(auVar49,auVar90);
                auVar119 = minps(auVar67,auVar119);
                auVar67 = maxps(auVar102,auVar120);
                auVar119 = minps(auVar119,auVar67);
                auVar69._0_4_ = auVar119._0_4_ * 1.0000004;
                auVar69._4_4_ = auVar119._4_4_ * 1.0000004;
                auVar69._8_4_ = auVar119._8_4_ * 1.0000004;
                auVar69._12_4_ = auVar119._12_4_ * 1.0000004;
                auVar50._8_4_ = auVar111._8_4_;
                auVar50._0_8_ = auVar111._0_8_;
                auVar50._12_4_ = auVar111._12_4_;
                auVar119 = maxps(auVar50,(undefined1  [16])tray.tnear.field_0);
                auVar67 = minps(auVar69,(undefined1  [16])tray.tfar.field_0);
                auVar51._4_4_ = -(uint)(auVar119._4_4_ <= auVar67._4_4_);
                auVar51._0_4_ = -(uint)(auVar119._0_4_ <= auVar67._0_4_);
                auVar51._8_4_ = -(uint)(auVar119._8_4_ <= auVar67._8_4_);
                auVar51._12_4_ = -(uint)(auVar119._12_4_ <= auVar67._12_4_);
                uVar143 = movmskps((int)valid_i,auVar51);
                valid_i = (vint<4> *)(ulong)uVar143;
                if (uVar143 != 0) {
                  auVar70._4_4_ = fVar161;
                  auVar70._0_4_ = fVar158;
                  auVar70._8_4_ = fVar164;
                  auVar70._12_4_ = fVar167;
                  auVar119 = blendvps(auVar70,auVar111,auVar51);
                  if (uVar40 != 8) {
                    pNVar41->ptr = uVar40;
                    pNVar41 = pNVar41 + 1;
                    paVar37->v[0] = local_1a88;
                    paVar37->v[1] = fStack_1a84;
                    paVar37->v[2] = fStack_1a80;
                    paVar37->v[3] = fStack_1a7c;
                    paVar37 = paVar37 + 1;
                  }
                  local_1a88 = auVar119._0_4_;
                  fStack_1a84 = auVar119._4_4_;
                  fStack_1a80 = auVar119._8_4_;
                  fStack_1a7c = auVar119._12_4_;
                  uVar40 = uVar35;
                }
              }
            } while ((uVar35 != 8) &&
                    (valid_i = (vint<4> *)((long)&pIVar34->ptr + 1),
                    bVar42 = pIVar34 < (Intersectors *)0x3, pIVar34 = (Intersectors *)valid_i,
                    bVar42));
            sVar186 = 0;
            if (uVar40 == 8) {
LAB_0023f0d2:
              bVar42 = false;
              sVar186 = 4;
            }
            else {
              auVar52._4_4_ = -(uint)(fStack_1a84 < tray.tfar.field_0.v[1]);
              auVar52._0_4_ = -(uint)(local_1a88 < tray.tfar.field_0.v[0]);
              auVar52._8_4_ = -(uint)(fStack_1a80 < tray.tfar.field_0.v[2]);
              auVar52._12_4_ = -(uint)(fStack_1a7c < tray.tfar.field_0.v[3]);
              uVar32 = movmskps((int)(root.ptr & 0xfffffffffffffff0),auVar52);
              bVar42 = true;
              if ((uint)POPCOUNT(uVar32) <= uVar138) {
                pNVar41->ptr = uVar40;
                pNVar41 = pNVar41 + 1;
                paVar37->v[0] = local_1a88;
                paVar37->v[1] = fStack_1a84;
                paVar37->v[2] = fStack_1a80;
                paVar37->v[3] = fStack_1a7c;
                paVar37 = paVar37 + 1;
                goto LAB_0023f0d2;
              }
            }
            uVar32 = (undefined4)sVar186;
            root.ptr = uVar40;
          } while (bVar42);
        }
      }
      goto LAB_0023fa7a;
    }
  }
  return;
  while( true ) {
    pIVar34 = (Intersectors *)((long)&pIVar34->ptr + 1);
    lVar39 = lVar39 + 0x50;
    auVar54 = auVar61;
    if (valid_i <= pIVar34) break;
LAB_0023f131:
    v = (vuint<4> *)((long)pIVar34 * 0x50 + (root.ptr & 0xfffffffffffffff0));
    pSVar29 = context->scene;
    pSVar38 = (Scene *)0x0;
    local_1a58 = auVar54;
    local_19c8 = pSVar29;
    while (*(int *)(lVar39 + (long)pSVar38 * 4) != -1) {
      pfVar2 = (local_19c8->vertices).items[*(uint *)(lVar39 + -0x10 + (long)pSVar38 * 4)];
      uVar40 = (ulong)*(uint *)(lVar39 + -0x40 + (long)pSVar38 * 4);
      uVar35 = (ulong)*(uint *)(lVar39 + -0x30 + (long)pSVar38 * 4);
      fVar158 = pfVar2[uVar40];
      fVar161 = pfVar2[uVar40 + 1];
      fVar164 = pfVar2[uVar40 + 2];
      fVar167 = pfVar2[uVar35];
      fVar85 = pfVar2[uVar35 + 1];
      fVar98 = pfVar2[uVar35 + 2];
      uVar40 = (ulong)*(uint *)(lVar39 + -0x20 + (long)pSVar38 * 4);
      fVar107 = pfVar2[uVar40];
      fVar65 = pfVar2[uVar40 + 1];
      fVar76 = pfVar2[uVar40 + 2];
      local_1778 = v[3].field_0.v[0];
      lStack_1770 = v[3].field_0.v[1];
      local_1788 = v[4].field_0.v[0];
      lStack_1780 = v[4].field_0.v[1];
      fVar101 = *(float *)ray;
      fVar105 = *(float *)(ray + 4);
      fVar106 = *(float *)(ray + 8);
      fVar11 = *(float *)(ray + 0xc);
      fVar43 = *(float *)(ray + 0x10);
      fVar63 = *(float *)(ray + 0x14);
      fVar64 = *(float *)(ray + 0x18);
      fVar12 = *(float *)(ray + 0x1c);
      fVar66 = *(float *)(ray + 0x20);
      fVar74 = *(float *)(ray + 0x24);
      fVar75 = *(float *)(ray + 0x28);
      fVar13 = *(float *)(ray + 0x2c);
      fVar183 = fVar158 - fVar101;
      fVar184 = fVar158 - fVar105;
      fVar185 = fVar158 - fVar106;
      fVar158 = fVar158 - fVar11;
      fVar139 = fVar161 - fVar43;
      fVar144 = fVar161 - fVar63;
      fVar147 = fVar161 - fVar64;
      fVar161 = fVar161 - fVar12;
      fVar152 = fVar164 - fVar66;
      fVar154 = fVar164 - fVar74;
      fVar156 = fVar164 - fVar75;
      fVar164 = fVar164 - fVar13;
      fVar176 = fVar167 - fVar101;
      fVar178 = fVar167 - fVar105;
      fVar180 = fVar167 - fVar106;
      fVar167 = fVar167 - fVar11;
      fVar77 = fVar85 - fVar43;
      fVar83 = fVar85 - fVar63;
      fVar84 = fVar85 - fVar64;
      fVar85 = fVar85 - fVar12;
      fVar86 = fVar98 - fVar66;
      fVar92 = fVar98 - fVar74;
      fVar95 = fVar98 - fVar75;
      fVar98 = fVar98 - fVar13;
      fVar101 = fVar107 - fVar101;
      fVar105 = fVar107 - fVar105;
      fVar106 = fVar107 - fVar106;
      fVar107 = fVar107 - fVar11;
      fVar43 = fVar65 - fVar43;
      fVar63 = fVar65 - fVar63;
      fVar64 = fVar65 - fVar64;
      fVar65 = fVar65 - fVar12;
      fVar66 = fVar76 - fVar66;
      fVar74 = fVar76 - fVar74;
      fVar75 = fVar76 - fVar75;
      fVar76 = fVar76 - fVar13;
      fVar87 = fVar101 - fVar183;
      fVar93 = fVar105 - fVar184;
      fVar96 = fVar106 - fVar185;
      fVar99 = fVar107 - fVar158;
      fVar170 = fVar43 - fVar139;
      fVar173 = fVar63 - fVar144;
      fVar174 = fVar64 - fVar147;
      fVar175 = fVar65 - fVar161;
      fVar159 = fVar66 - fVar152;
      fVar162 = fVar74 - fVar154;
      fVar165 = fVar75 - fVar156;
      fVar168 = fVar76 - fVar164;
      fVar11 = *(float *)(ray + 0x60);
      fVar12 = *(float *)(ray + 100);
      fVar13 = *(float *)(ray + 0x68);
      fVar14 = *(float *)(ray + 0x6c);
      fVar15 = *(float *)(ray + 0x50);
      fVar16 = *(float *)(ray + 0x54);
      fVar17 = *(float *)(ray + 0x58);
      auVar25 = *(undefined1 (*) [12])(ray + 0x50);
      fVar18 = *(float *)(ray + 0x5c);
      fVar19 = *(float *)(ray + 0x40);
      fVar20 = *(float *)(ray + 0x44);
      fVar21 = *(float *)(ray + 0x48);
      fVar22 = *(float *)(ray + 0x4c);
      fVar124 = (fVar170 * (fVar66 + fVar152) - (fVar43 + fVar139) * fVar159) * fVar19 +
                ((fVar101 + fVar183) * fVar159 - (fVar66 + fVar152) * fVar87) * fVar15 +
                (fVar87 * (fVar43 + fVar139) - (fVar101 + fVar183) * fVar170) * fVar11;
      fVar129 = (fVar173 * (fVar74 + fVar154) - (fVar63 + fVar144) * fVar162) * fVar20 +
                ((fVar105 + fVar184) * fVar162 - (fVar74 + fVar154) * fVar93) * fVar16 +
                (fVar93 * (fVar63 + fVar144) - (fVar105 + fVar184) * fVar173) * fVar12;
      auVar127._0_8_ = CONCAT44(fVar129,fVar124);
      auVar127._8_4_ =
           (fVar174 * (fVar75 + fVar156) - (fVar64 + fVar147) * fVar165) * fVar21 +
           ((fVar106 + fVar185) * fVar165 - (fVar75 + fVar156) * fVar96) * fVar17 +
           (fVar96 * (fVar64 + fVar147) - (fVar106 + fVar185) * fVar174) * fVar13;
      auVar127._12_4_ =
           (fVar175 * (fVar76 + fVar164) - (fVar65 + fVar161) * fVar168) * fVar22 +
           ((fVar107 + fVar158) * fVar168 - (fVar76 + fVar164) * fVar99) * fVar18 +
           (fVar99 * (fVar65 + fVar161) - (fVar107 + fVar158) * fVar175) * fVar14;
      fVar88 = fVar183 - fVar176;
      fVar94 = fVar184 - fVar178;
      fVar97 = fVar185 - fVar180;
      fVar100 = fVar158 - fVar167;
      fVar132 = fVar139 - fVar77;
      fVar135 = fVar144 - fVar83;
      fVar136 = fVar147 - fVar84;
      fVar137 = fVar161 - fVar85;
      fVar108 = fVar152 - fVar86;
      fVar112 = fVar154 - fVar92;
      fVar114 = fVar156 - fVar95;
      fVar116 = fVar164 - fVar98;
      fVar160 = (fVar132 * (fVar152 + fVar86) - (fVar139 + fVar77) * fVar108) * fVar19 +
                ((fVar183 + fVar176) * fVar108 - (fVar152 + fVar86) * fVar88) * fVar15 +
                (fVar88 * (fVar139 + fVar77) - (fVar183 + fVar176) * fVar132) * fVar11;
      fVar163 = (fVar135 * (fVar154 + fVar92) - (fVar144 + fVar83) * fVar112) * fVar20 +
                ((fVar184 + fVar178) * fVar112 - (fVar154 + fVar92) * fVar94) * fVar16 +
                (fVar94 * (fVar144 + fVar83) - (fVar184 + fVar178) * fVar135) * fVar12;
      fVar166 = (fVar136 * (fVar156 + fVar95) - (fVar147 + fVar84) * fVar114) * fVar21 +
                ((fVar185 + fVar180) * fVar114 - (fVar156 + fVar95) * fVar97) * fVar17 +
                (fVar97 * (fVar147 + fVar84) - (fVar185 + fVar180) * fVar136) * fVar13;
      fVar169 = (fVar137 * (fVar164 + fVar98) - (fVar161 + fVar85) * fVar116) * fVar22 +
                ((fVar158 + fVar167) * fVar116 - (fVar164 + fVar98) * fVar100) * fVar18 +
                (fVar100 * (fVar161 + fVar85) - (fVar158 + fVar167) * fVar137) * fVar14;
      fVar140 = fVar176 - fVar101;
      fVar145 = fVar178 - fVar105;
      fVar148 = fVar180 - fVar106;
      fVar150 = fVar167 - fVar107;
      fVar109 = fVar77 - fVar43;
      fVar113 = fVar83 - fVar63;
      fVar115 = fVar84 - fVar64;
      fVar117 = fVar85 - fVar65;
      fVar177 = fVar86 - fVar66;
      fVar179 = fVar92 - fVar74;
      fVar181 = fVar95 - fVar75;
      fVar182 = fVar98 - fVar76;
      auVar79._0_4_ =
           (fVar109 * (fVar66 + fVar86) - (fVar43 + fVar77) * fVar177) * fVar19 +
           ((fVar101 + fVar176) * fVar177 - (fVar66 + fVar86) * fVar140) * fVar15 +
           (fVar140 * (fVar43 + fVar77) - (fVar101 + fVar176) * fVar109) * fVar11;
      auVar79._4_4_ =
           (fVar113 * (fVar74 + fVar92) - (fVar63 + fVar83) * fVar179) * fVar20 +
           ((fVar105 + fVar178) * fVar179 - (fVar74 + fVar92) * fVar145) * fVar16 +
           (fVar145 * (fVar63 + fVar83) - (fVar105 + fVar178) * fVar113) * fVar12;
      auVar79._8_4_ =
           (fVar115 * (fVar75 + fVar95) - (fVar64 + fVar84) * fVar181) * fVar21 +
           ((fVar106 + fVar180) * fVar181 - (fVar75 + fVar95) * fVar148) * fVar17 +
           (fVar148 * (fVar64 + fVar84) - (fVar106 + fVar180) * fVar115) * fVar13;
      auVar79._12_4_ =
           (fVar117 * (fVar76 + fVar98) - (fVar65 + fVar85) * fVar182) * fVar22 +
           ((fVar107 + fVar167) * fVar182 - (fVar76 + fVar98) * fVar150) * fVar18 +
           (fVar150 * (fVar65 + fVar85) - (fVar107 + fVar167) * fVar117) * fVar14;
      fVar167 = fVar124 + fVar160 + auVar79._0_4_;
      fVar85 = fVar129 + fVar163 + auVar79._4_4_;
      auVar103._0_8_ = CONCAT44(fVar85,fVar167);
      auVar103._8_4_ = auVar127._8_4_ + fVar166 + auVar79._8_4_;
      auVar103._12_4_ = auVar127._12_4_ + fVar169 + auVar79._12_4_;
      auVar55._8_4_ = auVar127._8_4_;
      auVar55._0_8_ = auVar127._0_8_;
      auVar55._12_4_ = auVar127._12_4_;
      auVar6._4_4_ = fVar163;
      auVar6._0_4_ = fVar160;
      auVar6._8_4_ = fVar166;
      auVar6._12_4_ = fVar169;
      auVar119 = minps(auVar55,auVar6);
      auVar119 = minps(auVar119,auVar79);
      auVar171._8_4_ = auVar127._8_4_;
      auVar171._0_8_ = auVar127._0_8_;
      auVar171._12_4_ = auVar127._12_4_;
      auVar7._4_4_ = fVar163;
      auVar7._0_4_ = fVar160;
      auVar7._8_4_ = fVar166;
      auVar7._12_4_ = fVar169;
      auVar67 = maxps(auVar171,auVar7);
      auVar67 = maxps(auVar67,auVar79);
      fVar167 = ABS(fVar167) * 1.1920929e-07;
      fVar85 = ABS(fVar85) * 1.1920929e-07;
      auVar172._0_8_ =
           CONCAT44(-(uint)(auVar67._4_4_ <= fVar85 || -fVar85 <= auVar119._4_4_) & local_1a58._4_4_
                    ,-(uint)(auVar67._0_4_ <= fVar167 || -fVar167 <= auVar119._0_4_) &
                     local_1a58._0_4_);
      auVar172._8_4_ =
           -(uint)(auVar67._8_4_ <= ABS(auVar103._8_4_) * 1.1920929e-07 ||
                  -(ABS(auVar103._8_4_) * 1.1920929e-07) <= auVar119._8_4_) & local_1a58._8_4_;
      auVar172._12_4_ =
           -(uint)(auVar67._12_4_ <= ABS(auVar103._12_4_) * 1.1920929e-07 ||
                  -(ABS(auVar103._12_4_) * 1.1920929e-07) <= auVar119._12_4_) & local_1a58._12_4_;
      iVar31 = movmskps((int)v,auVar172);
      uVar143 = (uint)DAT_01fec6c0;
      uVar146 = DAT_01fec6c0._4_4_;
      uVar149 = DAT_01fec6c0._8_4_;
      uVar118 = DAT_01fec6c0._12_4_;
      if (iVar31 == 0) {
        auVar123._8_4_ = auVar172._8_4_;
        auVar123._0_8_ = auVar172._0_8_;
        auVar123._12_4_ = auVar172._12_4_;
      }
      else {
        auVar104._0_4_ = fVar170 * fVar108 - fVar132 * fVar159;
        auVar104._4_4_ = fVar173 * fVar112 - fVar135 * fVar162;
        auVar104._8_4_ = fVar174 * fVar114 - fVar136 * fVar165;
        auVar104._12_4_ = fVar175 * fVar116 - fVar137 * fVar168;
        auVar133._0_4_ = fVar132 * fVar177 - fVar109 * fVar108;
        auVar133._4_4_ = fVar135 * fVar179 - fVar113 * fVar112;
        auVar133._8_4_ = fVar136 * fVar181 - fVar115 * fVar114;
        auVar133._12_4_ = fVar137 * fVar182 - fVar117 * fVar116;
        local_1a88 = auVar25._0_4_;
        fStack_1a84 = auVar25._4_4_;
        fStack_1a80 = auVar25._8_4_;
        auVar56._4_4_ =
             -(uint)((float)((uint)(fVar135 * fVar162) & uVar146) <
                    (float)((uint)(fVar113 * fVar112) & uVar146));
        auVar56._0_4_ =
             -(uint)((float)((uint)(fVar132 * fVar159) & uVar143) <
                    (float)((uint)(fVar109 * fVar108) & uVar143));
        auVar56._8_4_ =
             -(uint)((float)((uint)(fVar136 * fVar165) & uVar149) <
                    (float)((uint)(fVar115 * fVar114) & uVar149));
        auVar56._12_4_ =
             -(uint)((float)((uint)(fVar137 * fVar168) & uVar118) <
                    (float)((uint)(fVar117 * fVar116) & uVar118));
        auVar134 = blendvps(auVar133,auVar104,auVar56);
        auVar131._0_4_ = fVar159 * fVar88 - fVar87 * fVar108;
        auVar131._4_4_ = fVar162 * fVar94 - fVar93 * fVar112;
        auVar131._8_4_ = fVar165 * fVar97 - fVar96 * fVar114;
        auVar131._12_4_ = fVar168 * fVar100 - fVar99 * fVar116;
        auVar141._0_4_ = fVar140 * fVar108 - fVar88 * fVar177;
        auVar141._4_4_ = fVar145 * fVar112 - fVar94 * fVar179;
        auVar141._8_4_ = fVar148 * fVar114 - fVar97 * fVar181;
        auVar141._12_4_ = fVar150 * fVar116 - fVar100 * fVar182;
        auVar57._4_4_ =
             -(uint)((float)((uint)(fVar93 * fVar112) & uVar146) <
                    (float)((uint)(fVar94 * fVar179) & uVar146));
        auVar57._0_4_ =
             -(uint)((float)((uint)(fVar87 * fVar108) & uVar143) <
                    (float)((uint)(fVar88 * fVar177) & uVar143));
        auVar57._8_4_ =
             -(uint)((float)((uint)(fVar96 * fVar114) & uVar149) <
                    (float)((uint)(fVar97 * fVar181) & uVar149));
        auVar57._12_4_ =
             -(uint)((float)((uint)(fVar99 * fVar116) & uVar118) <
                    (float)((uint)(fVar100 * fVar182) & uVar118));
        auVar142 = blendvps(auVar141,auVar131,auVar57);
        auVar128._0_4_ = fVar87 * fVar132 - fVar88 * fVar170;
        auVar128._4_4_ = fVar93 * fVar135 - fVar94 * fVar173;
        auVar128._8_4_ = fVar96 * fVar136 - fVar97 * fVar174;
        auVar128._12_4_ = fVar99 * fVar137 - fVar100 * fVar175;
        auVar91._0_4_ = fVar88 * fVar109 - fVar140 * fVar132;
        auVar91._4_4_ = fVar94 * fVar113 - fVar145 * fVar135;
        auVar91._8_4_ = fVar97 * fVar115 - fVar148 * fVar136;
        auVar91._12_4_ = fVar100 * fVar117 - fVar150 * fVar137;
        auVar58._4_4_ =
             -(uint)((float)((uint)(fVar94 * fVar173) & uVar146) <
                    (float)((uint)(fVar145 * fVar135) & uVar146));
        auVar58._0_4_ =
             -(uint)((float)((uint)(fVar88 * fVar170) & uVar143) <
                    (float)((uint)(fVar140 * fVar132) & uVar143));
        auVar58._8_4_ =
             -(uint)((float)((uint)(fVar97 * fVar174) & uVar149) <
                    (float)((uint)(fVar148 * fVar136) & uVar149));
        auVar58._12_4_ =
             -(uint)((float)((uint)(fVar100 * fVar175) & uVar118) <
                    (float)((uint)(fVar150 * fVar137) & uVar118));
        auVar67 = blendvps(auVar91,auVar128,auVar58);
        fVar167 = fVar19 * auVar134._0_4_ + local_1a88 * auVar142._0_4_ + fVar11 * auVar67._0_4_;
        fVar85 = fVar20 * auVar134._4_4_ + fStack_1a84 * auVar142._4_4_ + fVar12 * auVar67._4_4_;
        fVar98 = fVar21 * auVar134._8_4_ + fStack_1a80 * auVar142._8_4_ + fVar13 * auVar67._8_4_;
        fVar107 = fVar22 * auVar134._12_4_ + fVar18 * auVar142._12_4_ + fVar14 * auVar67._12_4_;
        auVar121._0_4_ = fVar167 + fVar167;
        auVar121._4_4_ = fVar85 + fVar85;
        auVar121._8_4_ = fVar98 + fVar98;
        auVar121._12_4_ = fVar107 + fVar107;
        auVar71._0_4_ = fVar152 * auVar67._0_4_;
        auVar71._4_4_ = fVar154 * auVar67._4_4_;
        auVar71._8_4_ = fVar156 * auVar67._8_4_;
        auVar71._12_4_ = fVar164 * auVar67._12_4_;
        fVar85 = fVar183 * auVar134._0_4_ + fVar139 * auVar142._0_4_ + auVar71._0_4_;
        fVar98 = fVar184 * auVar134._4_4_ + fVar144 * auVar142._4_4_ + auVar71._4_4_;
        fVar107 = fVar185 * auVar134._8_4_ + fVar147 * auVar142._8_4_ + auVar71._8_4_;
        fVar65 = fVar158 * auVar134._12_4_ + fVar161 * auVar142._12_4_ + auVar71._12_4_;
        auVar119 = rcpps(auVar71,auVar121);
        fVar158 = auVar119._0_4_;
        fVar161 = auVar119._4_4_;
        fVar164 = auVar119._8_4_;
        fVar167 = auVar119._12_4_;
        fVar158 = ((1.0 - auVar121._0_4_ * fVar158) * fVar158 + fVar158) * (fVar85 + fVar85);
        fVar161 = ((1.0 - auVar121._4_4_ * fVar161) * fVar161 + fVar161) * (fVar98 + fVar98);
        fVar164 = ((1.0 - auVar121._8_4_ * fVar164) * fVar164 + fVar164) * (fVar107 + fVar107);
        fVar167 = ((1.0 - auVar121._12_4_ * fVar167) * fVar167 + fVar167) * (fVar65 + fVar65);
        bVar9 = fVar158 <= *(float *)(ray + 0x80) && *(float *)(ray + 0x30) <= fVar158;
        auVar79._0_4_ = (float)-(uint)bVar9;
        bVar10 = fVar161 <= *(float *)(ray + 0x84) && *(float *)(ray + 0x34) <= fVar161;
        auVar79._4_4_ = (float)-(uint)bVar10;
        bVar8 = fVar164 <= *(float *)(ray + 0x88) && *(float *)(ray + 0x38) <= fVar164;
        auVar79._8_4_ = (float)-(uint)bVar8;
        bVar42 = fVar167 <= *(float *)(ray + 0x8c) && *(float *)(ray + 0x3c) <= fVar167;
        auVar79._12_4_ = (float)-(uint)bVar42;
        auVar122._0_4_ = (int)((uint)(auVar121._0_4_ != 0.0 && bVar9) * -0x80000000) >> 0x1f;
        auVar122._4_4_ = (int)((uint)(auVar121._4_4_ != 0.0 && bVar10) * -0x80000000) >> 0x1f;
        auVar122._8_4_ = (int)((uint)(auVar121._8_4_ != 0.0 && bVar8) * -0x80000000) >> 0x1f;
        auVar122._12_4_ = (int)((uint)(auVar121._12_4_ != 0.0 && bVar42) * -0x80000000) >> 0x1f;
        auVar123 = auVar122 & auVar172;
        iVar31 = movmskps(iVar31,auVar123);
        if (iVar31 != 0) {
          uStack_17f0 = auVar127._8_8_;
          uStack_1840 = uStack_17f0;
          local_1858 = CONCAT44(fVar163,fVar160);
          uStack_1850 = CONCAT44(fVar169,fVar166);
          uStack_1810 = auVar103._8_8_;
          uStack_1860 = uStack_1810;
          local_18a8 = auVar67;
          local_1898 = auVar142;
          local_1888 = auVar134;
          local_1878 = fVar158;
          fStack_1874 = fVar161;
          fStack_1870 = fVar164;
          fStack_186c = fVar167;
          local_1868 = auVar103._0_8_;
          local_1848 = auVar127._0_8_;
        }
      }
      uVar28 = *(uint *)((long)&local_1778 + (long)pSVar38 * 4);
      pRVar3 = (context->scene->geometries).items;
      pGVar4 = pRVar3[uVar28].ptr;
      uVar1 = pGVar4->mask;
      auVar72._0_4_ = -(uint)((uVar1 & *(uint *)(ray + 0x90)) == 0);
      auVar72._4_4_ = -(uint)((uVar1 & *(uint *)(ray + 0x94)) == 0);
      auVar72._8_4_ = -(uint)((uVar1 & *(uint *)(ray + 0x98)) == 0);
      auVar72._12_4_ = -(uint)((uVar1 & *(uint *)(ray + 0x9c)) == 0);
      auVar73 = ~auVar72 & auVar123;
      iVar31 = movmskps((int)pRVar3,auVar73);
      if (iVar31 != 0) {
        uVar32 = *(undefined4 *)((long)&local_1788 + (long)pSVar38 * 4);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar24._8_8_ = uStack_1860;
          auVar24._0_8_ = local_1868;
          fVar85 = (float)((ulong)local_1868 >> 0x20);
          fVar98 = (float)((ulong)uStack_1860 >> 0x20);
          auVar119 = rcpps(auVar79,auVar24);
          fVar158 = auVar119._0_4_;
          fVar161 = auVar119._4_4_;
          fVar164 = auVar119._8_4_;
          fVar167 = auVar119._12_4_;
          fVar158 = (float)(-(uint)(1e-18 <= (float)((uint)(float)local_1868 & uVar143)) &
                           (uint)(((float)DAT_01feca10 - (float)local_1868 * fVar158) * fVar158 +
                                 fVar158));
          fVar161 = (float)(-(uint)(1e-18 <= (float)((uint)fVar85 & uVar146)) &
                           (uint)((DAT_01feca10._4_4_ - fVar85 * fVar161) * fVar161 + fVar161));
          fVar164 = (float)(-(uint)(1e-18 <= (float)((uint)(float)uStack_1860 & uVar149)) &
                           (uint)((DAT_01feca10._8_4_ - (float)uStack_1860 * fVar164) * fVar164 +
                                 fVar164));
          fVar167 = (float)(-(uint)(1e-18 <= (float)((uint)fVar98 & uVar118)) &
                           (uint)((DAT_01feca10._12_4_ - fVar98 * fVar167) * fVar167 + fVar167));
          auVar80._0_4_ = (float)local_1848 * fVar158;
          auVar80._4_4_ = local_1848._4_4_ * fVar161;
          auVar80._8_4_ = (float)uStack_1840 * fVar164;
          auVar80._12_4_ = uStack_1840._4_4_ * fVar167;
          local_1738 = minps(auVar80,_DAT_01feca10);
          auVar59._0_4_ = fVar158 * (float)local_1858;
          auVar59._4_4_ = fVar161 * local_1858._4_4_;
          auVar59._8_4_ = fVar164 * (float)uStack_1850;
          auVar59._12_4_ = fVar167 * uStack_1850._4_4_;
          local_1728 = minps(auVar59,_DAT_01feca10);
          local_1768 = local_1888._0_8_;
          uStack_1760 = local_1888._8_8_;
          local_1758 = local_1898._0_8_;
          uStack_1750 = local_1898._8_8_;
          local_1748 = local_18a8;
          local_1718 = uVar32;
          uStack_1714 = uVar32;
          uStack_1710 = uVar32;
          uStack_170c = uVar32;
          local_1708 = uVar28;
          uStack_1704 = uVar28;
          uStack_1700 = uVar28;
          uStack_16fc = uVar28;
          local_16f8 = context->user->instID[0];
          uStack_16f4 = local_16f8;
          uStack_16f0 = local_16f8;
          uStack_16ec = local_16f8;
          local_16e8 = context->user->instPrimID[0];
          uStack_16e4 = local_16e8;
          uStack_16e0 = local_16e8;
          uStack_16dc = local_16e8;
          auVar119 = *(undefined1 (*) [16])(ray + 0x80);
          auVar23._4_4_ = fStack_1874;
          auVar23._0_4_ = local_1878;
          auVar23._8_4_ = fStack_1870;
          auVar23._12_4_ = fStack_186c;
          auVar67 = blendvps(auVar119,auVar23,auVar73);
          *(undefined1 (*) [16])(ray + 0x80) = auVar67;
          args.valid = (int *)local_19d8;
          args.geometryUserPtr = pGVar4->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1768;
          args.N = 4;
          pRVar30 = (RTCRayN *)pGVar4->occlusionFilterN;
          local_19d8 = auVar73;
          args.ray = (RTCRayN *)ray;
          if (pRVar30 != (RTCRayN *)0x0) {
            pRVar30 = (RTCRayN *)(*(code *)pRVar30)(&args);
          }
          if (local_19d8 == (undefined1  [16])0x0) {
            auVar81._8_4_ = 0xffffffff;
            auVar81._0_8_ = 0xffffffffffffffff;
            auVar81._12_4_ = 0xffffffff;
            auVar81 = auVar81 ^ _DAT_01febe20;
          }
          else {
            p_Var5 = context->args->filter;
            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var5)(&args);
            }
            auVar60._0_4_ = -(uint)(local_19d8._0_4_ == 0);
            auVar60._4_4_ = -(uint)(local_19d8._4_4_ == 0);
            auVar60._8_4_ = -(uint)(local_19d8._8_4_ == 0);
            auVar60._12_4_ = -(uint)(local_19d8._12_4_ == 0);
            auVar81 = auVar60 ^ _DAT_01febe20;
            auVar67 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),auVar60);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar67;
            pRVar30 = args.ray;
          }
          uVar28 = (uint)pRVar30;
          auVar82._0_4_ = auVar81._0_4_ << 0x1f;
          auVar82._4_4_ = auVar81._4_4_ << 0x1f;
          auVar82._8_4_ = auVar81._8_4_ << 0x1f;
          auVar82._12_4_ = auVar81._12_4_ << 0x1f;
          auVar73._0_4_ = auVar82._0_4_ >> 0x1f;
          auVar73._4_4_ = auVar82._4_4_ >> 0x1f;
          auVar73._8_4_ = auVar82._8_4_ >> 0x1f;
          auVar73._12_4_ = auVar82._12_4_ >> 0x1f;
          auVar119 = blendvps(auVar119,*(undefined1 (*) [16])(ray + 0x80),auVar82);
          *(undefined1 (*) [16])(ray + 0x80) = auVar119;
        }
        local_1a58 = ~auVar73 & local_1a58;
      }
      fVar167 = INFINITY;
      fVar164 = INFINITY;
      fVar161 = INFINITY;
      fVar158 = INFINITY;
      uVar143 = movmskps(uVar28,local_1a58);
      pSVar29 = (Scene *)(ulong)uVar143;
      if ((uVar143 == 0) ||
         (pSVar29 = (Scene *)((long)&(pSVar38->super_AccelN).super_Accel.super_AccelData.
                                     super_RefCount._vptr_RefCount + 1),
         bVar42 = (Scene *)0x2 < pSVar38, pSVar38 = pSVar29, bVar42)) break;
    }
    auVar61._0_4_ = auVar54._0_4_ & local_1a58._0_4_;
    auVar61._4_4_ = auVar54._4_4_ & local_1a58._4_4_;
    auVar61._8_4_ = auVar54._8_4_ & local_1a58._8_4_;
    auVar61._12_4_ = auVar54._12_4_ & local_1a58._12_4_;
    iVar31 = movmskps((int)pSVar29,auVar61);
    if (iVar31 == 0) break;
  }
  uVar40 = CONCAT44(auVar61._4_4_,auVar61._0_4_);
  terminated.field_0._0_8_ = uVar40 ^ 0xffffffffffffffff;
  terminated.field_0.i[2] = auVar61._8_4_ ^ 0xffffffff;
  terminated.field_0.i[3] = auVar61._12_4_ ^ 0xffffffff;
LAB_0023fa44:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       ((undefined1  [16])vVar27.field_0 | (undefined1  [16])terminated.field_0);
  iVar31 = movmskps(iVar31,(undefined1  [16])terminated.field_0);
  if (iVar31 == 0xf) {
LAB_0023fa77:
    sVar186 = 3;
  }
  else {
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                  (undefined1  [16])terminated.field_0);
    sVar186 = 0;
  }
LAB_0023fa7a:
  paVar36 = paVar37;
  if ((int)sVar186 == 3) {
    auVar62._4_4_ = uVar153 & terminated.field_0.i[1];
    auVar62._0_4_ = uVar151 & terminated.field_0.i[0];
    auVar62._8_4_ = uVar155 & terminated.field_0.i[2];
    auVar62._12_4_ = uVar157 & terminated.field_0.i[3];
    auVar119 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01feba00,auVar62);
    *(undefined1 (*) [16])(ray + 0x80) = auVar119;
    return;
  }
  goto LAB_0023eeea;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }